

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int VP8LDistanceToPlaneCode(int xsize,int dist)

{
  int iVar1;
  int iVar2;
  int xoffset;
  int yoffset;
  int dist_local;
  int xsize_local;
  int local_4;
  
  iVar1 = dist / xsize;
  iVar2 = dist - iVar1 * xsize;
  if ((iVar2 < 9) && (iVar1 < 8)) {
    local_4 = plane_to_code_lut[(iVar1 * 0x10 + 8) - iVar2] + 1;
  }
  else if ((xsize + -8 < iVar2) && (iVar1 < 7)) {
    local_4 = plane_to_code_lut[(iVar1 + 1) * 0x10 + 8 + (xsize - iVar2)] + 1;
  }
  else {
    local_4 = dist + 0x78;
  }
  return local_4;
}

Assistant:

int VP8LDistanceToPlaneCode(int xsize, int dist) {
  const int yoffset = dist / xsize;
  const int xoffset = dist - yoffset * xsize;
  if (xoffset <= 8 && yoffset < 8) {
    return plane_to_code_lut[yoffset * 16 + 8 - xoffset] + 1;
  } else if (xoffset > xsize - 8 && yoffset < 7) {
    return plane_to_code_lut[(yoffset + 1) * 16 + 8 + (xsize - xoffset)] + 1;
  }
  return dist + 120;
}